

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

void free_yang_common(lys_module *module,lys_node *node)

{
  uint local_1c;
  uint i;
  lys_node *node_local;
  lys_module *module_local;
  
  yang_tpdf_free(module->ctx,module->tpdf,'\0',module->tpdf_size);
  module->tpdf_size = '\0';
  yang_free_ident_base(module->ident,0,(uint)module->ident_size);
  yang_free_nodes(module->ctx,node);
  for (local_1c = 0; local_1c < module->augment_size; local_1c = local_1c + 1) {
    yang_free_augment(module->ctx,module->augment + local_1c);
  }
  module->augment_size = '\0';
  for (local_1c = 0; local_1c < module->deviation_size; local_1c = local_1c + 1) {
    yang_free_deviate(module->ctx,module->deviation + local_1c,0);
    free(module->deviation[local_1c].deviate);
  }
  module->deviation_size = '\0';
  return;
}

Assistant:

static void
free_yang_common(struct lys_module *module, struct lys_node *node)
{
    uint i;
    yang_tpdf_free(module->ctx, module->tpdf, 0, module->tpdf_size);
    module->tpdf_size = 0;
    yang_free_ident_base(module->ident, 0, module->ident_size);
    yang_free_nodes(module->ctx, node);
    for (i = 0; i < module->augment_size; ++i) {
        yang_free_augment(module->ctx, &module->augment[i]);
    }
    module->augment_size = 0;
    for (i = 0; i < module->deviation_size; ++i) {
        yang_free_deviate(module->ctx, &module->deviation[i], 0);
        free(module->deviation[i].deviate);
    }
    module->deviation_size = 0;
}